

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O1

void duckdb::GatherColumnDataScans
               (PhysicalOperator *op,
               vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *delim_scans)

{
  pointer *pprVar1;
  iterator __position;
  pointer prVar2;
  reference_wrapper<duckdb::PhysicalOperator> *child;
  pointer prVar3;
  reference_wrapper<const_duckdb::PhysicalOperator> local_20;
  
  if ((byte)(op->type - CTE_SCAN) < 2) {
    __position._M_current =
         (delim_scans->
         super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         ).
         super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_20._M_data = op;
    if (__position._M_current ==
        (delim_scans->
        super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
        ).
        super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                  *)delim_scans,__position,&local_20);
    }
    else {
      (__position._M_current)->_M_data = op;
      pprVar1 = &(delim_scans->
                 super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
  }
  prVar2 = (op->children).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar3 = (op->children).
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar3 != prVar2; prVar3 = prVar3 + 1) {
    GatherColumnDataScans(prVar3->_M_data,delim_scans);
  }
  return;
}

Assistant:

static void GatherColumnDataScans(const PhysicalOperator &op, vector<const_reference<PhysicalOperator>> &delim_scans) {
	if (op.type == PhysicalOperatorType::DELIM_SCAN || op.type == PhysicalOperatorType::CTE_SCAN) {
		delim_scans.push_back(op);
	}
	for (auto &child : op.children) {
		GatherColumnDataScans(child, delim_scans);
	}
}